

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::~gemm_blocking_space
          (gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *this)

{
  double *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  aligned_delete<double>(in_RDI,in_stack_ffffffffffffffe8);
  aligned_delete<double>(in_RDI,in_stack_ffffffffffffffe8);
  aligned_delete<double>(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

~gemm_blocking_space()
    {
      aligned_delete(this->m_blockA, m_sizeA);
      aligned_delete(this->m_blockB, m_sizeB);
      aligned_delete(this->m_blockW, m_sizeW);
    }